

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

void Acec_TreeFindTrees2_rec
               (Vec_Int_t *vAdds,Vec_Int_t *vMap,int iAdd,int Rank,Vec_Int_t *vTree,
               Vec_Bit_t *vFound)

{
  int iVar1;
  int iObj;
  
  iVar1 = Vec_BitEntry(vFound,iAdd);
  if (iVar1 == 0) {
    Vec_BitWriteEntry(vFound,iAdd,1);
    Vec_IntPush(vTree,iAdd);
    Vec_IntPush(vTree,Rank);
    for (iVar1 = 0; iVar1 != 5; iVar1 = iVar1 + 1) {
      iObj = Vec_IntEntry(vAdds,iVar1 + iAdd * 6);
      Acec_TreeFindTrees_rec(vAdds,vMap,iObj,(uint)(iVar1 == 4) + Rank,vTree,vFound);
    }
  }
  return;
}

Assistant:

void Acec_TreeFindTrees2_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iAdd, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound )
{
    extern void Acec_TreeFindTrees_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iObj, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound );
    int k;
    if ( Vec_BitEntry(vFound, iAdd) )
        return;
    Vec_BitWriteEntry( vFound, iAdd, 1 );
    Vec_IntPush( vTree, iAdd );
    Vec_IntPush( vTree, Rank );
    //printf( "Assigning rank %d to (%d:%d).\n", Rank, Vec_IntEntry(vAdds, 6*iAdd+3), Vec_IntEntry(vAdds, 6*iAdd+4) );
    for ( k = 0; k < 5; k++ )
        Acec_TreeFindTrees_rec( vAdds, vMap, Vec_IntEntry(vAdds, 6*iAdd+k), k == 4 ? Rank + 1 : Rank, vTree, vFound );
}